

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShuffledDeckGenerator.cpp
# Opt level: O0

Deck * __thiscall
solitaire::cards::ShuffledDeckGenerator::generateSortedDeck
          (Deck *__return_storage_ptr__,ShuffledDeckGenerator *this)

{
  bool bVar1;
  reference pSVar2;
  reference pvVar3;
  value_type local_60;
  reference local_58;
  Value *value;
  const_iterator __end3;
  const_iterator __begin3;
  vector<solitaire::cards::Value,_std::allocator<solitaire::cards::Value>_> *__range3;
  Suit *suit;
  const_iterator __end2;
  const_iterator __begin2;
  vector<solitaire::cards::Suit,_std::allocator<solitaire::cards::Suit>_> *__range2;
  uint index;
  ShuffledDeckGenerator *this_local;
  
  std::array<solitaire::cards::Card,_52UL>::array(__return_storage_ptr__);
  __range2._4_4_ = 0;
  __end2 = std::vector<solitaire::cards::Suit,_std::allocator<solitaire::cards::Suit>_>::begin
                     ((vector<solitaire::cards::Suit,_std::allocator<solitaire::cards::Suit>_> *)
                      suits);
  suit = (Suit *)std::vector<solitaire::cards::Suit,_std::allocator<solitaire::cards::Suit>_>::end
                           ((vector<solitaire::cards::Suit,_std::allocator<solitaire::cards::Suit>_>
                             *)suits);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_solitaire::cards::Suit_*,_std::vector<solitaire::cards::Suit,_std::allocator<solitaire::cards::Suit>_>_>
                                *)&suit);
    if (!bVar1) break;
    pSVar2 = __gnu_cxx::
             __normal_iterator<const_solitaire::cards::Suit_*,_std::vector<solitaire::cards::Suit,_std::allocator<solitaire::cards::Suit>_>_>
             ::operator*(&__end2);
    __end3 = std::vector<solitaire::cards::Value,_std::allocator<solitaire::cards::Value>_>::begin
                       ((vector<solitaire::cards::Value,_std::allocator<solitaire::cards::Value>_> *
                        )values);
    value = (Value *)std::vector<solitaire::cards::Value,_std::allocator<solitaire::cards::Value>_>
                     ::end((vector<solitaire::cards::Value,_std::allocator<solitaire::cards::Value>_>
                            *)values);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end3,(__normal_iterator<const_solitaire::cards::Value_*,_std::vector<solitaire::cards::Value,_std::allocator<solitaire::cards::Value>_>_>
                                  *)&value);
      if (!bVar1) break;
      local_58 = __gnu_cxx::
                 __normal_iterator<const_solitaire::cards::Value_*,_std::vector<solitaire::cards::Value,_std::allocator<solitaire::cards::Value>_>_>
                 ::operator*(&__end3);
      Card::Card(&local_60,*local_58,*pSVar2);
      pvVar3 = std::array<solitaire::cards::Card,_52UL>::operator[]
                         (__return_storage_ptr__,(ulong)__range2._4_4_);
      *pvVar3 = local_60;
      __gnu_cxx::
      __normal_iterator<const_solitaire::cards::Value_*,_std::vector<solitaire::cards::Value,_std::allocator<solitaire::cards::Value>_>_>
      ::operator++(&__end3);
      __range2._4_4_ = __range2._4_4_ + 1;
    }
    __gnu_cxx::
    __normal_iterator<const_solitaire::cards::Suit_*,_std::vector<solitaire::cards::Suit,_std::allocator<solitaire::cards::Suit>_>_>
    ::operator++(&__end2);
  }
  return __return_storage_ptr__;
}

Assistant:

Deck ShuffledDeckGenerator::generateSortedDeck() const {
    Deck generatedDeck;
    unsigned index = 0;
    for (const auto& suit: suits)
        for (const auto& value: values)
            generatedDeck[index++] = Card {value, suit};
    return generatedDeck;
}